

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

void __thiscall
QTreeWidgetPrivate::selectionChanged
          (QTreeWidgetPrivate *this,QItemSelection *selected,QItemSelection *deselected)

{
  byte *pbVar1;
  long lVar2;
  QObject *pQVar3;
  undefined1 *puVar4;
  long *plVar5;
  long lVar6;
  long in_FS_OFFSET;
  QArrayData *local_68;
  long lStack_60;
  long local_58;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = *(QObject **)
            &(this->super_QTreeViewPrivate).super_QAbstractItemViewPrivate.
             super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  QItemSelection::indexes();
  QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
  puVar4 = &DAT_aaaaaaaaaaaaaaaa;
  plVar5 = (long *)&DAT_aaaaaaaaaaaaaaba;
  do {
    lVar6 = *plVar5;
    if (lVar6 != 0) {
      lVar6 = plVar5[-1];
    }
    if ((int)(*(uint *)((long)plVar5 + -0xc) | *(uint *)(plVar5 + -2)) < 0) {
      lVar6 = 0;
    }
    pbVar1 = (byte *)(*(long *)(lVar6 + 0x30) + 0x20);
    *pbVar1 = *pbVar1 | 2;
    plVar5 = plVar5 + 3;
    puVar4 = puVar4 + -1;
  } while (puVar4 != (undefined1 *)0x0);
  QItemSelection::indexes();
  LOCK();
  _DAT_aaaaaaaaaaaaaaaa = _DAT_aaaaaaaaaaaaaaaa + -1;
  UNLOCK();
  if (_DAT_aaaaaaaaaaaaaaaa == 0) {
    QArrayData::deallocate((QArrayData *)&DAT_aaaaaaaaaaaaaaaa,0x18,0x10);
  }
  if (local_58 != 0) {
    plVar5 = (long *)(lStack_60 + 0x10);
    do {
      lVar6 = *plVar5;
      if (lVar6 != 0) {
        lVar6 = plVar5[-1];
      }
      if ((int)(*(uint *)((long)plVar5 + -0xc) | *(uint *)(plVar5 + -2)) < 0) {
        lVar6 = 0;
      }
      pbVar1 = (byte *)(*(long *)(lVar6 + 0x30) + 0x20);
      *pbVar1 = *pbVar1 & 0xfd;
      plVar5 = plVar5 + 3;
      local_58 = local_58 + -1;
    } while (local_58 != 0);
  }
  QMetaObject::activate(pQVar3,&QTreeWidget::staticMetaObject,9,(void **)0x0);
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,0x18,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeWidgetPrivate::selectionChanged(const QItemSelection &selected, const QItemSelection &deselected)
{
    Q_Q(QTreeWidget);
    QModelIndexList indices = selected.indexes();
    int i;
    QTreeModel *m = treeModel();
    for (i = 0; i < indices.size(); ++i) {
        QTreeWidgetItem *item = m->item(indices.at(i));
        item->d->selected = true;
    }

    indices = deselected.indexes();
    for (i = 0; i < indices.size(); ++i) {
        QTreeWidgetItem *item = m->item(indices.at(i));
        item->d->selected = false;
    }

    emit q->itemSelectionChanged();
}